

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O0

bool __thiscall draco::ObjEncoder::EncodeMaterialFileName(ObjEncoder *this)

{
  bool bVar1;
  byte bVar2;
  reference ppVar3;
  mapped_type *this_00;
  PointAttribute *pPVar4;
  size_t sVar5;
  ObjEncoder *in_RDI;
  int value;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>
  *entry;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
  *__range1;
  string material_full_path;
  string material_file_name;
  AttributeMetadata *material_metadata;
  GeometryMetadata *pc_metadata;
  string *in_stack_fffffffffffffe38;
  Metadata *in_stack_fffffffffffffe40;
  PointCloud *in_stack_fffffffffffffe48;
  int *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  void *in_stack_fffffffffffffe60;
  EncoderBuffer *in_stack_fffffffffffffe68;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  char *in_stack_fffffffffffffe78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  string *in_stack_fffffffffffffe98;
  string *in_stack_fffffffffffffea0;
  undefined6 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeae;
  undefined1 in_stack_fffffffffffffeaf;
  _Self local_108;
  _Self local_100;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
  *local_f8;
  allocator<char> local_e9;
  string local_e8 [36];
  undefined4 local_c4;
  string local_c0 [32];
  string local_a0 [39];
  allocator<char> local_79;
  string local_78 [55];
  allocator<char> local_41;
  string local_40 [32];
  AttributeMetadata *local_20;
  GeometryMetadata *local_18;
  byte local_1;
  
  local_18 = PointCloud::GetMetadata((PointCloud *)0x123b08);
  local_20 = (AttributeMetadata *)0x0;
  if (local_18 != (GeometryMetadata *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
    local_20 = GeometryMetadata::GetAttributeMetadataByStringEntry
                         ((GeometryMetadata *)
                          CONCAT17(in_stack_fffffffffffffeaf,
                                   CONCAT16(in_stack_fffffffffffffeae,in_stack_fffffffffffffea8)),
                          in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator(&local_79);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  std::__cxx11::string::string(local_a0);
  std::__cxx11::string::string(local_c0);
  if (local_20 == (AttributeMetadata *)0x0) {
    local_1 = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
    bVar1 = Metadata::GetEntryString
                      (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,(string *)0x123d1e);
    bVar2 = bVar1 ^ 0xff;
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator(&local_e9);
    if ((bVar2 & 1) == 0) {
      buffer(in_RDI);
      EncoderBuffer::Encode
                (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                 CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      buffer(in_RDI);
      std::__cxx11::string::c_str();
      std::__cxx11::string::size();
      EncoderBuffer::Encode
                (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                 CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      buffer(in_RDI);
      EncoderBuffer::Encode
                (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                 CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      std::
      unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::clear((unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)0x123e68);
      local_f8 = Metadata::entries_abi_cxx11_(&local_20->super_Metadata);
      local_100._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
                    *)in_stack_fffffffffffffe38);
      local_108._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
                  *)in_stack_fffffffffffffe38);
      while (bVar1 = std::operator!=(&local_100,&local_108), bVar1) {
        ppVar3 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>
                 ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>
                              *)in_stack_fffffffffffffe40);
        bVar1 = EntryValue::GetValue<int>
                          ((EntryValue *)
                           CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                           in_stack_fffffffffffffe50);
        if (bVar1) {
          this_00 = std::
                    unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)in_stack_fffffffffffffe40,(key_type *)in_stack_fffffffffffffe38)
          ;
          std::__cxx11::string::operator=((string *)this_00,(string *)ppVar3);
        }
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>
        ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>
                      *)in_stack_fffffffffffffe40);
      }
      AttributeMetadata::att_unique_id(local_20);
      pPVar4 = PointCloud::GetAttributeByUniqueId
                         (in_stack_fffffffffffffe48,
                          (uint32_t)((ulong)in_stack_fffffffffffffe40 >> 0x20));
      in_RDI->material_att_ = pPVar4;
      if ((in_RDI->material_att_ == (PointAttribute *)0x0) ||
         (sVar5 = PointAttribute::size(in_RDI->material_att_), sVar5 == 0)) {
        local_1 = 0;
      }
      else {
        local_1 = 1;
      }
    }
    else {
      local_1 = 0;
    }
  }
  local_c4 = 1;
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_a0);
  return (bool)(local_1 & 1);
}

Assistant:

bool ObjEncoder::EncodeMaterialFileName() {
  const GeometryMetadata *pc_metadata = in_point_cloud_->GetMetadata();
  const AttributeMetadata *material_metadata = nullptr;
  if (pc_metadata) {
    material_metadata =
        pc_metadata->GetAttributeMetadataByStringEntry("name", "material");
  }
  std::string material_file_name;
  std::string material_full_path;
  if (!material_metadata) {
    return true;
  }
  if (!material_metadata->GetEntryString("file_name", &material_file_name))
    return false;
  buffer()->Encode("mtllib ", 7);
  buffer()->Encode(material_file_name.c_str(), material_file_name.size());
  buffer()->Encode("\n", 1);
  material_id_to_name_.clear();
  for (const auto &entry : material_metadata->entries()) {
    // Material id must be int.
    int value = 0;
    // Found entry that are not material id, e.g. file name as a string.
    if (!entry.second.GetValue(&value)) {
      continue;
    }
    material_id_to_name_[value] = entry.first;
  }
  material_att_ = in_point_cloud_->GetAttributeByUniqueId(
      material_metadata->att_unique_id());
  if (material_att_ == nullptr || material_att_->size() == 0) {
    return false;
  }
  return true;
}